

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

void __thiscall
Apple::IIgs::Sound::GLU::generate_audio<(Outputs::Speaker::Action)1>
          (GLU *this,size_t number_of_samples,MonoSample *target)

{
  EnsoniqState *ram;
  uint8_t *puVar1;
  atomic<Apple::IIgs::Sound::GLU::MemoryWrite> aVar2;
  byte bVar3;
  int16_t iVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  byte bVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  Oscillator *this_00;
  ulong uVar12;
  uint32_t local_78;
  
  aVar2._M_i = this->pending_stores_[this->pending_store_read_]._M_i;
  if (number_of_samples != 0) {
    bVar3 = aVar2._M_i.enabled & 1;
    ram = &this->remote_;
    uVar7 = (ulong)aVar2._M_i >> 0x20 & 0xffff;
    uVar10 = 0xff;
    sVar9 = 0;
    do {
      if ((this->remote_).oscillator_count < 1) {
        iVar5 = 0;
      }
      else {
        uVar12 = 0;
        iVar5 = 0;
        this_00 = (this->remote_).oscillators;
        do {
          bVar8 = this_00->control;
          if ((bVar8 & 1) == 0) {
            uVar11 = (uint)this_00->velocity + this_00->position;
            this_00->position = uVar11;
            switch(bVar8 & 6) {
            case 0:
              iVar4 = EnsoniqState::Oscillator::output(this_00,ram->ram_);
              iVar5 = iVar5 + iVar4;
              break;
            case 2:
              if ((this_00->overflow_mask & uVar11) != 0) {
                this_00->position = 0;
                this_00->control = bVar8 | 1;
              }
              break;
            case 4:
              if ((uVar12 & 1) != 0) {
                bVar8 = 8 - (this_00->table_size >> 3 & 7);
                uVar10 = (uint)ram->ram_[-0x10000 >> (bVar8 & 0x1f) & (uint)this_00->address << 8 |
                                         uVar11 >> ((this_00->table_size & 7) + bVar8 & 0x1f) &
                                         0xffffU >> (bVar8 & 0x1f)];
                goto LAB_0029ac76;
              }
              uVar11 = uVar11 & this_00->overflow_mask;
              if (uVar11 != 0) {
                this_00->position = uVar11;
                this_00[1].position = 0;
              }
              break;
            case 6:
              if ((this_00->overflow_mask & uVar11) != 0) {
                this_00->control = bVar8 | 1;
                this_00->position = 0;
                puVar1 = &(this->remote_).oscillators[uVar12 ^ 1].control;
                *puVar1 = *puVar1 & 0xfe;
              }
            }
            if ((this_00->control & 1) == 0) {
              iVar4 = EnsoniqState::Oscillator::output(this_00,ram->ram_);
              iVar5 = (int)(uVar10 * (int)iVar4) / 0xff + iVar5;
              uVar10 = 0xff;
            }
          }
LAB_0029ac76:
          uVar12 = uVar12 + 1;
          this_00 = this_00 + 1;
        } while ((long)uVar12 < (long)(this->remote_).oscillator_count);
      }
      target[sVar9] = target[sVar9] + (short)(this->output_range_ * iVar5 >> 0x14);
      uVar6 = this->pending_store_read_time_ + 1;
      this->pending_store_read_time_ = uVar6;
      local_78 = aVar2._M_i.time;
      if ((bVar3 & uVar6 == local_78) != 0) {
        (this->remote_).ram_[uVar7] = aVar2._M_i.value;
        this->pending_stores_[this->pending_store_read_]._M_i =
             (MemoryWrite)((ulong)aVar2._M_i & 0xff0000ffffffff | uVar7 << 0x20);
        this->pending_store_read_ = this->pending_store_read_ + 1 & 0x3fff;
        bVar3 = 0;
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 != number_of_samples);
  }
  return;
}

Assistant:

void GLU::generate_audio(size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	auto next_store = pending_stores_[pending_store_read_].load(std::memory_order::memory_order_acquire);
	uint8_t next_amplitude = 255;
	for(size_t sample = 0; sample < number_of_samples; sample++) {

		// TODO: there's a bit of a hack here where it is assumed that the input clock has been
		// divided in advance. Real hardware divides by 8, I think?

		// Seed output as 0.
		int output = 0;

		// Apply phase updates to all enabled oscillators.
		for(int c = 0; c < remote_.oscillator_count; c++) {
			// Don't do anything for halted oscillators.
			if(remote_.oscillators[c].control&1) continue;

			remote_.oscillators[c].position += remote_.oscillators[c].velocity;

			// Test for a new halting event.
			switch(remote_.oscillators[c].control & 6) {
				case 0:	// Free-run mode; don't truncate the position at all, in case the
						// accumulator bits in use changes.
					output += remote_.oscillators[c].output(remote_.ram_);
				break;

				case 2:	// One-shot mode; check for end of run. Otherwise update sample.
					if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
						remote_.oscillators[c].position = 0;
						remote_.oscillators[c].control |= 1;
					}
				break;

				case 4:	// Sync/AM mode.
					if(c&1) {
						// Oscillator is odd-numbered; it will amplitude-modulate the next voice.
						next_amplitude = remote_.oscillators[c].sample(remote_.ram_);
						continue;
					} else {
						// Oscillator is even-numbered; it will 'sync' to the even voice, i.e. any
						// time it wraps around, it will reset the next oscillator.
						if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
							remote_.oscillators[c].position &= remote_.oscillators[c].overflow_mask;
							remote_.oscillators[c+1].position = 0;
						}
					}
				break;

				case 6:	// Swap mode; possibly trigger partner, and update sample.
						// Per tech note #11: "Whenever a swap occurs from a higher-numbered
						// oscillator to a lower-numbered one, the output signal from the corresponding
						// generator temporarily falls to the zero-crossing level (silence)"
					if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
						remote_.oscillators[c].control |= 1;
						remote_.oscillators[c].position = 0;
						remote_.oscillators[c^1].control &= ~1;
					}
				break;
			}

			// Don't add output for newly-halted oscillators.
			if(remote_.oscillators[c].control&1) continue;

			// Append new output.
			output += (remote_.oscillators[c].output(remote_.ram_) * next_amplitude) / 255;
			next_amplitude = 255;
		}

		// Maximum total output was 32 channels times a 16-bit range. Map that down.
		// TODO: dynamic total volume?
		Outputs::Speaker::apply<action>(
			target[sample],
			Outputs::Speaker::MonoSample(
				(output * output_range_) >> 20
			)
		);

		// Apply any RAM writes that interleave here.
		++pending_store_read_time_;
		if(!next_store.enabled) continue;
		if(next_store.time != pending_store_read_time_) continue;
		remote_.ram_[next_store.address] = next_store.value;
		next_store.enabled = false;
		pending_stores_[pending_store_read_].store(next_store, std::memory_order::memory_order_relaxed);
		pending_store_read_ = (pending_store_read_ + 1) & (StoreBufferSize - 1);
	}
}